

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkDch(Abc_Ntk_t *pNtk,Dch_Pars_t *pPars)

{
  Aig_Man_t *pAVar1;
  abctime aVar2;
  Gia_Man_t *p;
  abctime aVar3;
  Aig_Man_t *pAig;
  Abc_Ntk_t *pAVar4;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    pAVar1 = Abc_NtkToDar(pNtk,0,0);
    if (pAVar1 == (Aig_Man_t *)0x0) {
      pAVar4 = (Abc_Ntk_t *)0x0;
    }
    else {
      aVar2 = Abc_Clock();
      if (pPars->fSynthesis == 0) {
        p = Gia_ManFromAig(pAVar1);
        Aig_ManStop(pAVar1);
      }
      else {
        p = Dar_NewChoiceSynthesis(pAVar1,1,1,pPars->fPower,pPars->fLightSynth,pPars->fVerbose);
      }
      aVar3 = Abc_Clock();
      pPars->timeSynth = aVar3 - aVar2;
      if (pPars->fUseGia == 0) {
        pAig = Gia_ManToAigSkip(p,3);
        Gia_ManStop(p);
        pAVar1 = Dch_ComputeChoices(pAig,pPars);
        Aig_ManStop(pAig);
      }
      else {
        pAVar1 = Cec_ComputeChoices(p,pPars);
      }
      pAVar4 = Abc_NtkFromDarChoices(pNtk,pAVar1);
      Aig_ManStop(pAVar1);
    }
    return pAVar4;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                ,0x67c,"Abc_Ntk_t *Abc_NtkDch(Abc_Ntk_t *, Dch_Pars_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkDch( Abc_Ntk_t * pNtk, Dch_Pars_t * pPars )
{
    extern Gia_Man_t * Dar_NewChoiceSynthesis( Aig_Man_t * pAig, int fBalance, int fUpdateLevel, int fPower, int fLightSynth, int fVerbose );
    extern Aig_Man_t * Cec_ComputeChoices( Gia_Man_t * pGia, Dch_Pars_t * pPars );

    Aig_Man_t * pMan, * pTemp;
    Abc_Ntk_t * pNtkAig;
    Gia_Man_t * pGia;
    abctime clk;
    assert( Abc_NtkIsStrash(pNtk) );
    pMan = Abc_NtkToDar( pNtk, 0, 0 );
    if ( pMan == NULL )
        return NULL;
clk = Abc_Clock();
    if ( pPars->fSynthesis )
        pGia = Dar_NewChoiceSynthesis( pMan, 1, 1, pPars->fPower, pPars->fLightSynth, pPars->fVerbose );
    else
    {
        pGia = Gia_ManFromAig( pMan );
        Aig_ManStop( pMan );
    }
pPars->timeSynth = Abc_Clock() - clk;
    if ( pPars->fUseGia )
        pMan = Cec_ComputeChoices( pGia, pPars );
    else
    {
        pMan = Gia_ManToAigSkip( pGia, 3 );
        Gia_ManStop( pGia );
        pMan = Dch_ComputeChoices( pTemp = pMan, pPars );
        Aig_ManStop( pTemp );
    }
    pNtkAig = Abc_NtkFromDarChoices( pNtk, pMan );
    Aig_ManStop( pMan );
    return pNtkAig;
}